

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

void __thiscall dg::llvmdg::LLVMSlicer::LLVMSlicer(LLVMSlicer *this)

{
  Slicer<dg::LLVMNode> *in_RDI;
  uint32_t in_stack_ffffffffffffffec;
  
  Slicer<dg::LLVMNode>::Slicer(in_RDI,in_stack_ffffffffffffffec);
  in_RDI->_vptr_Slicer = (_func_int **)&PTR_removeNode_001fdac8;
  std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::set
            ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)0x19d9c6);
  return;
}

Assistant:

LLVMSlicer() = default;